

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# week8-midterm.cpp
# Opt level: O2

void print<std::__cxx11::string,unsigned_long>
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                *m)

{
  ostream *poVar1;
  _Base_ptr p_Var2;
  
  for (p_Var2 = (m->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(m->_M_t)._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    poVar1 = std::operator<<((ostream *)&std::cout,"<");
    poVar1 = std::operator<<(poVar1,(string *)(p_Var2 + 1));
    std::operator<<(poVar1,">: ");
    print<unsigned_long>((unsigned_long *)(p_Var2 + 2));
  }
  return;
}

Assistant:

void print(const std::map<Key, Value>& m)
{
    for(const auto& [key, value] : m)
    {
        std::cout << "<" << key << ">: ";
        print(value);
    }
}